

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O1

void __thiscall
higan::MultiplexEpoll::FillActiveChannelList
          (MultiplexEpoll *this,int active_event_num,ChannelList *active_channel_list)

{
  pointer *pppCVar1;
  pointer peVar2;
  iterator __position;
  long lVar3;
  Channel *local_38;
  Channel *channel;
  
  if (0 < active_event_num && active_channel_list != (ChannelList *)0x0) {
    lVar3 = 0;
    do {
      peVar2 = (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_38 = *(Channel **)((long)&peVar2->data + lVar3);
      if (local_38 != (Channel *)0x0) {
        Channel::SetChannelReadable
                  (local_38,(bool)((byte)*(undefined4 *)((long)&peVar2->events + lVar3) & 1));
        Channel::SetChannelWritable
                  (local_38,SUB41((*(uint *)((long)&((this->epoll_events_).
                                                                                                          
                                                  super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->events
                                            + lVar3) & 4) >> 2,0));
        Channel::SetChannelError
                  (local_38,(*(byte *)((long)&((this->epoll_events_).
                                               super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->events +
                                      lVar3) & 0x18) != 0);
        __position._M_current =
             (active_channel_list->
             super__Vector_base<higan::Channel_*,_std::allocator<higan::Channel_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (active_channel_list->
            super__Vector_base<higan::Channel_*,_std::allocator<higan::Channel_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<higan::Channel*,std::allocator<higan::Channel*>>::
          _M_realloc_insert<higan::Channel*const&>
                    ((vector<higan::Channel*,std::allocator<higan::Channel*>> *)active_channel_list,
                     __position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppCVar1 = &(active_channel_list->
                      super__Vector_base<higan::Channel_*,_std::allocator<higan::Channel_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
      }
      lVar3 = lVar3 + 0xc;
    } while ((ulong)(uint)active_event_num * 0xc != lVar3);
  }
  return;
}

Assistant:

void MultiplexEpoll::FillActiveChannelList(int active_event_num, MultiplexBase::ChannelList* active_channel_list)
{
	if (active_channel_list == nullptr)
	{
		return;
	}

	for (int i = 0; i < active_event_num; ++i)
	{

		Channel* channel = static_cast<Channel*>(epoll_events_[i].data.ptr);

		if (channel == nullptr)
		{
			continue;
		}

		channel->SetChannelReadable(epoll_events_[i].events & EPOLLIN);
		channel->SetChannelWritable(epoll_events_[i].events & EPOLLOUT);
		channel->SetChannelError(epoll_events_[i].events & (EPOLLERR | EPOLLHUP));

		active_channel_list->push_back(channel);
	}
}